

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::AttributeInstanceSyntax*>::
emplaceRealloc<slang::syntax::AttributeInstanceSyntax*>
          (SmallVectorBase<slang::syntax::AttributeInstanceSyntax*> *this,pointer pos,
          AttributeInstanceSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppAVar3;
  AttributeInstanceSyntax **__result;
  AttributeInstanceSyntax **ppAVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  AttributeInstanceSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppAVar3 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
  __result = (AttributeInstanceSyntax **)slang::detail::allocArray(capacity,8);
  ppAVar4 = __result + ((long)pos - (long)ppAVar3 >> 3);
  *ppAVar4 = *args;
  ppAVar3 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
  if (pos == ppAVar3) {
    ppAVar3 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::AttributeInstanceSyntax**,slang::syntax::AttributeInstanceSyntax**>
              (ppAVar3,(AttributeInstanceSyntax **)ctx,__result);
  }
  else {
    ppAVar3 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::AttributeInstanceSyntax**,slang::syntax::AttributeInstanceSyntax**>
              (ppAVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::AttributeInstanceSyntax**,slang::syntax::AttributeInstanceSyntax**>
              (pos,(AttributeInstanceSyntax **)ctx,ppAVar4 + 1);
  }
  SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(AttributeInstanceSyntax ***)this = __result;
  return ppAVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}